

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
::Map(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
      *this,Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
            *other)

{
  const_iterator first;
  const_iterator last;
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
  local_78;
  Node *local_58;
  InnerMap *pIStack_50;
  size_type local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  this->arena_ = (Arena *)0x0;
  this->default_enum_value_ = other->default_enum_value_;
  Init(this);
  local_78.m_ = other->elements_;
  InnerMap::
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
  ::SearchFrom(&local_78,(local_78.m_)->index_of_first_non_null_);
  local_58 = local_78.node_;
  pIStack_50 = local_78.m_;
  local_48 = local_78.bucket_index_;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  first.it_.m_ = local_78.m_;
  first.it_.node_ = local_78.node_;
  first.it_.bucket_index_ = local_78.bucket_index_;
  last.it_.bucket_index_ = 0;
  last.it_.node_ = (Node *)0x0;
  last.it_.m_ = (InnerMap *)0x0;
  Map<std::__cxx11::string,google::protobuf::Value>::
  insert<google::protobuf::Map<std::__cxx11::string,google::protobuf::Value>::const_iterator>
            ((Map<std::__cxx11::string,google::protobuf::Value> *)this,first,last);
  return;
}

Assistant:

Map(const Map& other)
      : arena_(nullptr), default_enum_value_(other.default_enum_value_) {
    Init();
    insert(other.begin(), other.end());
  }